

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O0

Hsh_IntMan_t * Hsh_IntManStart(Vec_Int_t *vData,int nSize,int nEntries)

{
  int nSize_00;
  Hsh_IntMan_t *pHVar1;
  Vec_Int_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  Hsh_IntMan_t *p;
  int nEntries_local;
  int nSize_local;
  Vec_Int_t *vData_local;
  
  pHVar1 = (Hsh_IntMan_t *)calloc(1,0x20);
  pHVar1->nSize = nSize;
  pHVar1->vData = vData;
  nSize_00 = Abc_PrimeCudd(nEntries);
  pVVar2 = Vec_IntStartFull(nSize_00);
  pHVar1->vTable = pVVar2;
  pVVar3 = Vec_WrdAlloc(nEntries);
  pHVar1->vObjs = pVVar3;
  return pHVar1;
}

Assistant:

static inline Hsh_IntMan_t * Hsh_IntManStart( Vec_Int_t * vData, int nSize, int nEntries )
{
    Hsh_IntMan_t * p;
    p = ABC_CALLOC( Hsh_IntMan_t, 1 );
    p->nSize  = nSize;
    p->vData  = vData;
    p->vTable = Vec_IntStartFull( Abc_PrimeCudd(nEntries) );
    p->vObjs  = Vec_WrdAlloc( nEntries );
    return p;
}